

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<unsigned_char>::~Array(Array<unsigned_char> *this)

{
  uchar *puVar1;
  size_t sVar2;
  
  puVar1 = this->ptr;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = this->size_;
    this->ptr = (uchar *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,puVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }